

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::PrintOnOneLine(char *str,int max_length)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  
  if ((str != (char *)0x0) && (cVar1 = *str, cVar1 != '\0')) {
    pcVar3 = str + 1;
    uVar4 = 0;
    do {
      if (0xf9 < uVar4) {
        printf("...");
        return;
      }
      if (cVar1 == '\n') {
        printf("\\n");
        iVar2 = 2;
      }
      else {
        putchar((int)cVar1);
        iVar2 = 1;
      }
      uVar4 = uVar4 + iVar2;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  return;
}

Assistant:

static void PrintOnOneLine(const char* str, int max_length) {
  if (str != NULL) {
    for (int i = 0; *str != '\0'; ++str) {
      if (i >= max_length) {
        printf("...");
        break;
      }
      if (*str == '\n') {
        printf("\\n");
        i += 2;
      } else {
        printf("%c", *str);
        ++i;
      }
    }
  }
}